

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::IsTraceEnabled(BackwardPass *this)

{
  Phase phase;
  bool bVar1;
  bool bVar2;
  ExecutionMode EVar3;
  uint uVar4;
  uint uVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  
  phase = this->tag;
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,phase,uVar4,uVar5);
  if (bVar1) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,SimpleJitPhase,uVar4,uVar5);
    bVar1 = true;
    if (!bVar2) {
      EVar3 = JITTimeWorkItem::GetJitMode(this->func->m_workItem);
      bVar1 = EVar3 != SimpleJit;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
BackwardPass::IsTraceEnabled() const
{
    return
        Js::Configuration::Global.flags.Trace.IsEnabled(tag, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()) &&
        (PHASE_TRACE(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
}